

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O3

ssize_t sendto(int __fd,void *__buf,size_t __n,int __flags,sockaddr *__addr,socklen_t __addr_len)

{
  rpchook_t *prVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  ssize_t sVar7;
  pollfd local_40;
  sockaddr *local_38;
  
  if (g_sys_sendto_func == (sendto_pfn_t)0x0) {
    g_sys_sendto_func = (sendto_pfn_t)dlsym(0xffffffffffffffff,"sendto");
  }
  bVar3 = co_is_enable_sys_hook();
  if ((((!bVar3) || (999999 < (uint)__fd)) ||
      (prVar1 = g_rpchook_socket_fd[(uint)__fd], prVar1 == (rpchook_t *)0x0)) ||
     ((prVar1->user_flag & 0x800) != 0)) {
    sVar7 = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
    return sVar7;
  }
  local_38 = __addr;
  uVar4 = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
  uVar6 = uVar4;
  if ((long)uVar4 < 0) {
    piVar5 = __errno_location();
    if (*piVar5 != 0xb) {
      return uVar4;
    }
    uVar4 = 0;
    uVar6 = uVar4;
  }
  do {
    if (__n <= uVar4) {
LAB_00104c2c:
      if (0 < (long)uVar6) {
        uVar6 = uVar4;
      }
      if (uVar4 == 0) {
        uVar4 = uVar6;
      }
      return uVar4;
    }
    auVar2 = SEXT816(0x20c49ba5e353f7cf) * SEXT816((prVar1->write_timeout).tv_usec);
    local_40.events = 0x1c;
    local_40.revents = 0;
    local_40.fd = __fd;
    poll(&local_40,1,
         ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) +
         (int)(prVar1->write_timeout).tv_sec * 1000);
    uVar6 = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)local_38,__addr_len);
    if ((long)uVar6 < 0) {
      piVar5 = __errno_location();
      if (*piVar5 == 0xb) {
        *piVar5 = 0x7c5;
      }
      goto LAB_00104c2c;
    }
    uVar4 = uVar4 + uVar6;
  } while( true );
}

Assistant:

ssize_t sendto(int socket, const void *message, size_t length,
	                 int flags, const struct sockaddr *dest_addr,
					               socklen_t dest_len)
{
	/*
		1.no enable sys call ? sys
		2.( !lp || lp is non block ) ? sys
		3.try
		4.wait
		5.try
	*/
	HOOK_SYS_FUNC( sendto );
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
	}

	rpchook_t *lp = get_by_fd( socket );
	if( !lp || ( O_NONBLOCK & lp->user_flag ) )
	{
		return g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
	}

	ssize_t ret = g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );

	if( ret < 0 && (EAGAIN == errno || EWOULDBLOCK == errno)){
		ret = 0;
	}

	if(ret<0) return ret;

	size_t bytes_written = ret;
	while(bytes_written < length){
		int timeout = ( lp->write_timeout.tv_sec * 1000 ) 
					+ ( lp->write_timeout.tv_usec / 1000 );


		struct pollfd pf = { 0 };
		pf.fd = socket;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );
		poll( &pf,1,timeout );

		ret = g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
		if(ret <0 ){
			//timeout from co_routine_poll, errno set to indicate special value
			if( errno == EAGAIN  || errno == EWOULDBLOCK ){
				//poll timed out , the socket is still unwritable
				errno = LIBCO_POLL_TIMEOUT;
			}
			break;
		}
		bytes_written += ret ;
	}
	if (ret <= 0 && bytes_written == 0){
		return ret;
	}
	return bytes_written;
}